

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (serializer<toml::type_config> *this,local_date_type *d,local_date_format_info *param_3,
          source_location *param_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  ostream *in_stack_fffffffffffffe60;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe60);
  toml::operator<<(in_stack_fffffffffffffe60,(local_date *)in_stack_fffffffffffffe58);
  std::__cxx11::ostringstream::str();
  string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
            (in_stack_fffffffffffffe58);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe60);
  return in_RDI;
}

Assistant:

string_type operator()(const local_date_type& d, const local_date_format_info&, const source_location&) // {{{
    {
        std::ostringstream oss;
        oss << d;
        return string_conv<string_type>(oss.str());
    }